

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O0

void libcellml::structuredErrorCallback(void *userData,xmlErrorPtr error)

{
  int iVar1;
  XmlDoc *doc;
  xmlParserCtxtPtr context;
  string errorString;
  xmlErrorPtr error_local;
  void *userData_local;
  
  if (structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_,"\\n",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_);
    }
  }
  std::regex_replace<std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
             error->message,&structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_,".",
             0);
  XmlDoc::addXmlError(*(XmlDoc **)((long)userData + 0x1a8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context)
  ;
  std::__cxx11::string::~string((string *)&context);
  return;
}

Assistant:

void structuredErrorCallback(void *userData, XML_ERROR_CALLBACK_ARGUMENT_TYPE error)
{
    static const std::regex newLineRegex("\\n");
    // Swap libxml2 carriage return for a period.
    std::string errorString = std::regex_replace(error->message, newLineRegex, ".");
    auto context = reinterpret_cast<xmlParserCtxtPtr>(userData);
    auto doc = reinterpret_cast<XmlDoc *>(context->_private);
    doc->addXmlError(errorString);
}